

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Document::parseDirectives(Document *this)

{
  Token *pTVar1;
  int local_54;
  undefined1 local_50 [8];
  Token T;
  bool isDirective;
  Document *this_local;
  
  T.Value.field_2._M_local_buf[0xf] = '\0';
  do {
    pTVar1 = peekNext(this);
    Token::Token((Token *)local_50,pTVar1);
    if (local_50._0_4_ == TK_TagDirective) {
      parseTAGDirective(this);
LAB_00227972:
      T.Value.field_2._M_local_buf[0xf] = '\x01';
      local_54 = 0;
    }
    else {
      if (local_50._0_4_ == TK_VersionDirective) {
        parseYAMLDirective(this);
        goto LAB_00227972;
      }
      local_54 = 3;
    }
    Token::~Token((Token *)local_50);
    if (local_54 != 0) {
      return (bool)(T.Value.field_2._M_local_buf[0xf] & 1);
    }
  } while( true );
}

Assistant:

bool Document::parseDirectives() {
  bool isDirective = false;
  while (true) {
    Token T = peekNext();
    if (T.Kind == Token::TK_TagDirective) {
      parseTAGDirective();
      isDirective = true;
    } else if (T.Kind == Token::TK_VersionDirective) {
      parseYAMLDirective();
      isDirective = true;
    } else
      break;
  }
  return isDirective;
}